

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::push_integer(Simulator *this,PCode *code)

{
  bool bVar1;
  string *psVar2;
  Symbol *pSVar3;
  int *value;
  simulator_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  int local_14c;
  StackSymbol local_148;
  undefined1 local_100 [8];
  Symbol symbol;
  int local_64;
  StackSymbol local_60;
  PCode *local_18;
  PCode *code_local;
  Simulator *this_local;
  
  local_18 = code;
  code_local = (PCode *)this;
  psVar2 = PCode::first_abi_cxx11_(code);
  bVar1 = Recognition::is_integer(psVar2);
  if (bVar1) {
    psVar2 = PCode::first_abi_cxx11_(local_18);
    local_64 = std::__cxx11::stoi(psVar2,(size_t *)0x0,10);
    StackSymbol::StackSymbol(&local_60,&local_64);
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_60);
    StackSymbol::~StackSymbol(&local_60);
  }
  else {
    psVar2 = PCode::first_abi_cxx11_(local_18);
    pSVar3 = ScopeTree::resolve(&this->tree_,psVar2);
    Symbol::Symbol((Symbol *)local_100,pSVar3);
    bVar1 = Symbol::is_assigned((Symbol *)local_100);
    if (!bVar1) {
      this_00 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_14c = eip(this);
      psVar2 = PCode::first_abi_cxx11_(local_18);
      std::operator+(&local_190,anon_var_dwarf_6e351 + 0xf,psVar2);
      std::operator+(&local_170,&local_190,anon_var_dwarf_a209);
      simulator_error::simulator_error(this_00,&local_14c,&local_170);
      __cxa_throw(this_00,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    value = Symbol::int_value((Symbol *)local_100);
    StackSymbol::StackSymbol(&local_148,value);
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_148);
    StackSymbol::~StackSymbol(&local_148);
    Symbol::~Symbol((Symbol *)local_100);
  }
  inc_eip(this);
  return;
}

Assistant:

void Simulator::push_integer(const PCode &code) {
    if (Recognition::is_integer(code.first())) {
        stack_.push_back(StackSymbol(std::stoi(code.first())));
    } else {
        Symbol symbol = tree_.resolve(code.first());
        if (symbol.is_assigned()) {
            stack_.push_back(StackSymbol(symbol.int_value()));
        } else {
            throw simulator_error(eip(), "变量 \"" + code.first() + "\" 未初始化而直接使用");
        }
    }
    inc_eip();
}